

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O2

bool __thiscall
nuraft::snapshot_io_mgr::push(snapshot_io_mgr *this,ptr<snapshot_io_mgr::io_queue_elem> *elem)

{
  element_type *peVar1;
  element_type *peVar2;
  long *plVar3;
  int iVar4;
  _List_node_base *p_Var5;
  list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  *this_00;
  string local_50;
  
  std::mutex::lock(&this->queue_lock_);
  peVar1 = (elem->
           super___shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar2 = (peVar1->raft_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  plVar3 = (long *)(peVar2->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
  this_00 = &this->queue_;
  p_Var5 = (_List_node_base *)this_00;
  do {
    do {
      p_Var5 = (((_List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                  *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var5 == (_List_node_base *)this_00) {
        std::__cxx11::
        list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
        ::push_back(this_00,elem);
        if (plVar3 == (long *)0x0) goto LAB_001afc4a;
        iVar4 = (**(code **)(*plVar3 + 0x38))(plVar3);
        if (iVar4 < 6) goto LAB_001afc4a;
        msg_if_given_abi_cxx11_
                  (&local_50,"added snapshot request for peer %d",
                   (ulong)*(uint *)(((((elem->
                                       super___shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr)->dst_).
                                     super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr)->config_).
                                   super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
        (**(code **)(*plVar3 + 0x40))
                  (plVar3,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                   ,"push",0x5d,&local_50);
        goto LAB_001afc40;
      }
    } while (*(element_type **)p_Var5[1]._M_next != peVar2);
  } while (*(int *)**(undefined8 **)((long)p_Var5[1]._M_next + 0x30) !=
           ((((peVar1->dst_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_
          );
  if (plVar3 != (long *)0x0) {
    iVar4 = (**(code **)(*plVar3 + 0x38))(plVar3);
    if (5 < iVar4) {
      msg_if_given_abi_cxx11_
                (&local_50,"snapshot request for peer %d already exists, do nothing",
                 (ulong)*(uint *)(((((elem->
                                     super___shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->dst_).
                                   super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->config_).
                                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
      (**(code **)(*plVar3 + 0x40))
                (plVar3,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                 ,"push",0x58,&local_50);
LAB_001afc40:
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
LAB_001afc4a:
  pthread_mutex_unlock((pthread_mutex_t *)&this->queue_lock_);
  return p_Var5 == (_List_node_base *)this_00;
}

Assistant:

bool snapshot_io_mgr::push(ptr<snapshot_io_mgr::io_queue_elem>& elem) {
    auto_lock(queue_lock_);
    logger* l_ = elem->raft_->l_.get();

    // If there is existing one for the same peer, ignore it.
    for (auto& entry: queue_) {
        if ( entry->raft_ == elem->raft_ &&
             entry->dst_->get_id() == elem->dst_->get_id() ) {
            p_tr("snapshot request for peer %d already exists, do nothing",
                 elem->dst_->get_id());
            return false;
        }
    }
    queue_.push_back(elem);
    p_tr("added snapshot request for peer %d", elem->dst_->get_id());

    return true;
}